

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O3

void __thiscall
DIS::DataQueryDatumSpecification::unmarshal
          (DataQueryDatumSpecification *this,DataStream *dataStream)

{
  uint *d;
  uint *d_00;
  pointer pUVar1;
  pointer pUVar2;
  iterator iVar3;
  pointer pUVar4;
  ulong uVar5;
  UnsignedDISInteger x;
  UnsignedDISInteger local_48;
  vector<DIS::UnsignedDISInteger,std::allocator<DIS::UnsignedDISInteger>> *local_38;
  
  d = &this->_numberOfFixedDatums;
  DataStream::operator>>(dataStream,d);
  d_00 = &this->_numberOfVariableDatums;
  DataStream::operator>>(dataStream,d_00);
  pUVar1 = (this->_fixedDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->_fixedDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pUVar4 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      (**pUVar4->_vptr_UnsignedDISInteger)(pUVar4);
      pUVar4 = pUVar4 + 1;
    } while (pUVar4 != pUVar2);
    (this->_fixedDatumIDList).
    super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar1;
  }
  if (*d != 0) {
    local_38 = (vector<DIS::UnsignedDISInteger,std::allocator<DIS::UnsignedDISInteger>> *)
               &this->_fixedDatumIDList;
    uVar5 = 0;
    do {
      UnsignedDISInteger::UnsignedDISInteger(&local_48);
      UnsignedDISInteger::unmarshal(&local_48,dataStream);
      iVar3._M_current =
           (this->_fixedDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->_fixedDatumIDList).
          super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::UnsignedDISInteger,std::allocator<DIS::UnsignedDISInteger>>::
        _M_realloc_insert<DIS::UnsignedDISInteger_const&>(local_38,iVar3,&local_48);
      }
      else {
        (iVar3._M_current)->_vptr_UnsignedDISInteger =
             (_func_int **)&PTR__UnsignedDISInteger_001b65e0;
        (iVar3._M_current)->_val = local_48._val;
        (this->_fixedDatumIDList).
        super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      UnsignedDISInteger::~UnsignedDISInteger(&local_48);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *d);
  }
  pUVar1 = (this->_variableDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->_variableDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pUVar4 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      (**pUVar4->_vptr_UnsignedDISInteger)(pUVar4);
      pUVar4 = pUVar4 + 1;
    } while (pUVar4 != pUVar2);
    (this->_variableDatumIDList).
    super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar1;
  }
  if (*d_00 != 0) {
    uVar5 = 0;
    do {
      UnsignedDISInteger::UnsignedDISInteger(&local_48);
      UnsignedDISInteger::unmarshal(&local_48,dataStream);
      iVar3._M_current =
           (this->_variableDatumIDList).
           super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->_variableDatumIDList).
          super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::UnsignedDISInteger,std::allocator<DIS::UnsignedDISInteger>>::
        _M_realloc_insert<DIS::UnsignedDISInteger_const&>
                  ((vector<DIS::UnsignedDISInteger,std::allocator<DIS::UnsignedDISInteger>> *)
                   &this->_variableDatumIDList,iVar3,&local_48);
      }
      else {
        (iVar3._M_current)->_vptr_UnsignedDISInteger =
             (_func_int **)&PTR__UnsignedDISInteger_001b65e0;
        (iVar3._M_current)->_val = local_48._val;
        (this->_variableDatumIDList).
        super__Vector_base<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      UnsignedDISInteger::~UnsignedDISInteger(&local_48);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *d_00);
  }
  return;
}

Assistant:

void DataQueryDatumSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfFixedDatums;
    dataStream >> _numberOfVariableDatums;

     _fixedDatumIDList.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatums; idx++)
     {
        UnsignedDISInteger x;
        x.unmarshal(dataStream);
        _fixedDatumIDList.push_back(x);
     }

     _variableDatumIDList.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatums; idx++)
     {
        UnsignedDISInteger x;
        x.unmarshal(dataStream);
        _variableDatumIDList.push_back(x);
     }
}